

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O0

void __thiscall QMimeData::setUrls(QMimeData *this,QList<QUrl> *urls)

{
  long lVar1;
  QMimeDataPrivate *data;
  QString *in_RSI;
  QMimeDataPrivate *in_RDI;
  long in_FS_OFFSET;
  QMimeDataPrivate *d;
  QList<QVariant> *in_stack_ffffffffffffff58;
  QList<QUrl> *in_stack_ffffffffffffff60;
  QVariant *this_00;
  const_iterator in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  data = d_func((QMimeData *)0x3e5bb0);
  textUriListLiteral();
  QList<QUrl>::cbegin(in_stack_ffffffffffffff60);
  QList<QUrl>::cend(in_stack_ffffffffffffff60);
  QList<QVariant>::QList<QList<QUrl>::const_iterator,_true>
            ((QList<QVariant> *)data,(const_iterator)in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  this_00 = (QVariant *)&stack0xffffffffffffffd8;
  ::QVariant::QVariant(this_00,in_stack_ffffffffffffff58);
  QMimeDataPrivate::setData(in_RDI,in_RSI,(QVariant *)data);
  ::QVariant::~QVariant(this_00);
  QList<QVariant>::~QList((QList<QVariant> *)0x3e5c41);
  QString::~QString((QString *)0x3e5c4b);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeData::setUrls(const QList<QUrl> &urls)
{
    Q_D(QMimeData);
    d->setData(textUriListLiteral(), QList<QVariant>(urls.cbegin(), urls.cend()));
}